

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O1

S2Point * __thiscall S2CellId::ToPoint(S2Point *__return_storage_ptr__,S2CellId *this)

{
  double dVar1;
  S2Point local_28;
  
  ToPointRaw(&local_28,this);
  dVar1 = local_28.c_[2] * local_28.c_[2] +
          local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar1 = (double)(~-(ulong)(dVar1 != 0.0) & (ulong)dVar1 |
                  (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0));
  __return_storage_ptr__->c_[0] = local_28.c_[0] * dVar1;
  __return_storage_ptr__->c_[1] = local_28.c_[1] * dVar1;
  __return_storage_ptr__->c_[2] = dVar1 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point ToPoint() const { return ToPointRaw().Normalize(); }